

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFormatErrorNodeQName(xmlChar **str,xmlSchemaNodeInfoPtr ni,xmlNodePtr node)

{
  xmlNodePtr node_local;
  xmlSchemaNodeInfoPtr ni_local;
  xmlChar **str_local;
  
  if (node == (xmlNodePtr)0x0) {
    if (ni == (xmlSchemaNodeInfoPtr)0x0) {
      str_local = (xmlChar **)0x0;
    }
    else {
      str_local = (xmlChar **)xmlSchemaFormatQName(str,ni->nsName,ni->localName);
    }
  }
  else if (node->ns == (xmlNs *)0x0) {
    str_local = (xmlChar **)xmlSchemaFormatQName(str,(xmlChar *)0x0,node->name);
  }
  else {
    str_local = (xmlChar **)xmlSchemaFormatQName(str,node->ns->href,node->name);
  }
  return (xmlChar *)str_local;
}

Assistant:

static const xmlChar *
xmlSchemaFormatErrorNodeQName(xmlChar ** str,
			      xmlSchemaNodeInfoPtr ni,
			      xmlNodePtr node)
{
    if (node != NULL) {
	if (node->ns != NULL)
	    return (xmlSchemaFormatQName(str, node->ns->href, node->name));
	else
	    return (xmlSchemaFormatQName(str, NULL, node->name));
    } else if (ni != NULL)
	return (xmlSchemaFormatQName(str, ni->nsName, ni->localName));
    return (NULL);
}